

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry_test.cpp
# Opt level: O1

void __thiscall RegJson_CreateEmptyRegistry_Test::TestBody(RegJson_CreateEmptyRegistry_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  Status SVar3;
  char *in_R9;
  AssertionResult gtest_ar_;
  Registry reg;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  AssertHelper local_58;
  internal local_50 [8];
  undefined8 *local_48;
  string local_40;
  Registry local_20;
  
  unlink("./tmp/registry_test.json");
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"./tmp/registry_test.json","")
  ;
  ot::commissioner::persistent_storage::Registry::Registry(&local_20,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  SVar3 = ot::commissioner::persistent_storage::Registry::Open(&local_20);
  local_50[0] = (internal)(SVar3 == kSuccess);
  local_48 = (undefined8 *)0x0;
  if (!(bool)local_50[0]) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,local_50,(AssertionResult *)"reg.Open() == Registry::Status::kSuccess",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x38,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  puVar2 = local_48;
  if (local_48 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_48 != local_48 + 2) {
      operator_delete((undefined8 *)*local_48);
    }
    operator_delete(puVar2);
  }
  SVar3 = ot::commissioner::persistent_storage::Registry::Close(&local_20);
  local_50[0] = (internal)(SVar3 == kSuccess);
  local_48 = (undefined8 *)0x0;
  if (!(bool)local_50[0]) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,local_50,(AssertionResult *)"reg.Close() == Registry::Status::kSuccess",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x39,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  puVar2 = local_48;
  if (local_48 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_48 != local_48 + 2) {
      operator_delete((undefined8 *)*local_48);
    }
    operator_delete(puVar2);
  }
  ot::commissioner::persistent_storage::Registry::~Registry(&local_20);
  return;
}

Assistant:

TEST(RegJson, CreateEmptyRegistry)
{
    unlink(json_path);
    Registry reg(json_path);

    EXPECT_TRUE(reg.Open() == Registry::Status::kSuccess);
    EXPECT_TRUE(reg.Close() == Registry::Status::kSuccess);
}